

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::allocatePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkCommandPoolCreateInfo cmdPoolParams;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  VkCommandPool local_88;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_80;
  undefined1 local_60 [24];
  VkAllocationCallbacks *pVStack_48;
  VkCommandPoolCreateInfo local_40;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_40.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_40.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_60,vk,device,&local_40,
             (VkAllocationCallbacks *)0x0);
  local_88.m_internal = CONCAT44(local_60._4_4_,local_60._0_4_);
  DStack_80.m_device = (VkDevice)local_60._16_8_;
  DStack_80.m_allocator = pVStack_48;
  DStack_80.m_deviceIface = (DeviceInterface *)local_60._8_8_;
  local_60._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_60._8_8_ = (DeviceInterface *)0x0;
  pVStack_48 = (VkAllocationCallbacks *)0x100000000;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_c8,vk,device,
             (VkCommandBufferAllocateInfo *)local_60);
  local_98 = local_b8;
  uStack_94 = uStack_b4;
  uStack_90 = uStack_b0;
  uStack_8c = uStack_ac;
  local_a8 = local_c8._0_4_;
  uStack_a4 = local_c8._4_4_;
  uStack_a0 = local_c8._8_4_;
  uStack_9c = local_c8._12_4_;
  local_c8._0_8_ = (VkCommandBuffer_s *)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"Buffer was created correctly.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_c8._0_8_,
             (VkCommandBuffer_s *)(local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8._8_4_)));
  if ((VkCommandBuffer_s *)local_c8._0_8_ != (VkCommandBuffer_s *)&local_b8) {
    operator_delete((void *)local_c8._0_8_,CONCAT44(uStack_b4,local_b8) + 1);
  }
  if ((VkCommandBuffer_s *)CONCAT44(uStack_a4,local_a8) != (VkCommandBuffer_s *)0x0) {
    local_c8._0_8_ = (VkCommandBuffer_s *)CONCAT44(uStack_a4,local_a8);
    (**(code **)(*(long *)CONCAT44(uStack_9c,uStack_a0) + 0x240))
              ((long *)CONCAT44(uStack_9c,uStack_a0),CONCAT44(uStack_94,local_98),
               CONCAT44(uStack_8c,uStack_90),1);
  }
  if (local_88.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_80,local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocatePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// commandPool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// level;
		1u,															// bufferCount;
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	return tcu::TestStatus::pass("Buffer was created correctly.");
}